

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O1

void nn_btcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_usock *self_00;
  nn_ctx **self_01;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong extraout_RAX;
  nn_list_item *it;
  nn_list_item *pnVar4;
  nn_fsm *owner;
  char *pcVar5;
  size_t sVar6;
  nn_atcp *pnVar7;
  nn_btcp *self_02;
  nn_fsm *self_03;
  int iStack_f4;
  size_t sStack_f0;
  size_t sStack_e8;
  sockaddr_storage sStack_e0;
  nn_fsm *pnStack_58;
  ulong uStack_50;
  
  if (type == -3 && src == -2) goto LAB_0012c44c;
  while( true ) {
    if ((*(int *)&self[1].fn == 3) && (nn_btcp_shutdown_cold_2(), (extraout_RAX & 1) != 0)) {
      return;
    }
    uVar1 = *(uint *)&self[1].fn;
    self_02 = (nn_btcp *)(ulong)uVar1;
    if (uVar1 == 4) {
      iVar2 = nn_usock_isidle((nn_usock *)&self[1].srcptr);
      if (iVar2 == 0) {
        return;
      }
      iVar2 = nn_backoff_isidle((nn_backoff *)&self[8].stopped.src);
      if (iVar2 == 0) {
        return;
      }
      self_01 = &self[8].ctx;
      for (it = nn_list_begin((nn_list *)self_01); pnVar4 = nn_list_end((nn_list *)self_01),
          it != pnVar4; it = nn_list_next((nn_list *)self_01,it)) {
        pnVar7 = (nn_atcp *)(it + -0x73);
        if (it == (nn_list_item *)0x0) {
          pnVar7 = (nn_atcp *)0x0;
        }
        nn_atcp_stop(pnVar7);
      }
      *(undefined4 *)&self[1].fn = 5;
      goto LAB_0012c509;
    }
    if (uVar1 == 5) break;
    nn_btcp_shutdown_cold_4();
LAB_0012c44c:
    nn_btcp_shutdown_cold_1();
  }
  if ((src == 2) && (type == 0x85b9)) {
    nn_list_erase((nn_list *)&self[8].ctx,(nn_list_item *)((long)srcptr + 0x730));
    nn_atcp_term((nn_atcp *)srcptr);
    nn_free(srcptr);
LAB_0012c509:
    iVar2 = nn_list_empty((nn_list *)&self[8].ctx);
    if (iVar2 == 0) {
      return;
    }
    *(undefined4 *)&self[1].fn = 1;
    nn_fsm_stopped_noevent(self);
    nn_epbase_stopped((nn_epbase *)&self[1].shutdown_fn);
    return;
  }
  nn_btcp_shutdown_cold_3();
  pnStack_58 = self;
  uStack_50 = (ulong)(uint)src;
  owner = (nn_fsm *)nn_epbase_getaddr(&self_02->epbase);
  sStack_e0.ss_family = 0;
  sStack_e0.__ss_padding[0] = '\0';
  sStack_e0.__ss_padding[1] = '\0';
  sStack_e0.__ss_padding[2] = '\0';
  sStack_e0.__ss_padding[3] = '\0';
  sStack_e0.__ss_padding[4] = '\0';
  sStack_e0.__ss_padding[5] = '\0';
  sStack_e0.__ss_padding[6] = '\0';
  sStack_e0.__ss_padding[7] = '\0';
  sStack_e0.__ss_padding[8] = '\0';
  sStack_e0.__ss_padding[9] = '\0';
  sStack_e0.__ss_padding[10] = '\0';
  sStack_e0.__ss_padding[0xb] = '\0';
  sStack_e0.__ss_padding[0xc] = '\0';
  sStack_e0.__ss_padding[0xd] = '\0';
  sStack_e0.__ss_padding[0xe] = '\0';
  sStack_e0.__ss_padding[0xf] = '\0';
  sStack_e0.__ss_padding[0x10] = '\0';
  sStack_e0.__ss_padding[0x11] = '\0';
  sStack_e0.__ss_padding[0x12] = '\0';
  sStack_e0.__ss_padding[0x13] = '\0';
  sStack_e0.__ss_padding[0x14] = '\0';
  sStack_e0.__ss_padding[0x15] = '\0';
  sStack_e0.__ss_padding[0x16] = '\0';
  sStack_e0.__ss_padding[0x17] = '\0';
  sStack_e0.__ss_padding[0x18] = '\0';
  sStack_e0.__ss_padding[0x19] = '\0';
  sStack_e0.__ss_padding[0x1a] = '\0';
  sStack_e0.__ss_padding[0x1b] = '\0';
  sStack_e0.__ss_padding[0x1c] = '\0';
  sStack_e0.__ss_padding[0x1d] = '\0';
  sStack_e0.__ss_padding[0x1e] = '\0';
  sStack_e0.__ss_padding[0x1f] = '\0';
  sStack_e0.__ss_padding[0x20] = '\0';
  sStack_e0.__ss_padding[0x21] = '\0';
  sStack_e0.__ss_padding[0x22] = '\0';
  sStack_e0.__ss_padding[0x23] = '\0';
  sStack_e0.__ss_padding[0x24] = '\0';
  sStack_e0.__ss_padding[0x25] = '\0';
  sStack_e0.__ss_padding[0x26] = '\0';
  sStack_e0.__ss_padding[0x27] = '\0';
  sStack_e0.__ss_padding[0x28] = '\0';
  sStack_e0.__ss_padding[0x29] = '\0';
  sStack_e0.__ss_padding[0x2a] = '\0';
  sStack_e0.__ss_padding[0x2b] = '\0';
  sStack_e0.__ss_padding[0x2c] = '\0';
  sStack_e0.__ss_padding[0x2d] = '\0';
  sStack_e0.__ss_padding[0x2e] = '\0';
  sStack_e0.__ss_padding[0x2f] = '\0';
  sStack_e0.__ss_padding[0x30] = '\0';
  sStack_e0.__ss_padding[0x31] = '\0';
  sStack_e0.__ss_padding[0x32] = '\0';
  sStack_e0.__ss_padding[0x33] = '\0';
  sStack_e0.__ss_padding[0x34] = '\0';
  sStack_e0.__ss_padding[0x35] = '\0';
  sStack_e0.__ss_padding[0x36] = '\0';
  sStack_e0.__ss_padding[0x37] = '\0';
  sStack_e0.__ss_padding[0x38] = '\0';
  sStack_e0.__ss_padding[0x39] = '\0';
  sStack_e0.__ss_padding[0x3a] = '\0';
  sStack_e0.__ss_padding[0x3b] = '\0';
  sStack_e0.__ss_padding[0x3c] = '\0';
  sStack_e0.__ss_padding[0x3d] = '\0';
  sStack_e0.__ss_padding[0x3e] = '\0';
  sStack_e0.__ss_padding[0x3f] = '\0';
  sStack_e0.__ss_padding[0x40] = '\0';
  sStack_e0.__ss_padding[0x41] = '\0';
  sStack_e0.__ss_padding[0x42] = '\0';
  sStack_e0.__ss_padding[0x43] = '\0';
  sStack_e0.__ss_padding[0x44] = '\0';
  sStack_e0.__ss_padding[0x45] = '\0';
  sStack_e0.__ss_padding[0x46] = '\0';
  sStack_e0.__ss_padding[0x47] = '\0';
  sStack_e0.__ss_padding[0x48] = '\0';
  sStack_e0.__ss_padding[0x49] = '\0';
  sStack_e0.__ss_padding[0x4a] = '\0';
  sStack_e0.__ss_padding[0x4b] = '\0';
  sStack_e0.__ss_padding[0x4c] = '\0';
  sStack_e0.__ss_padding[0x4d] = '\0';
  sStack_e0.__ss_padding[0x4e] = '\0';
  sStack_e0.__ss_padding[0x4f] = '\0';
  sStack_e0.__ss_padding[0x50] = '\0';
  sStack_e0.__ss_padding[0x51] = '\0';
  sStack_e0.__ss_padding[0x52] = '\0';
  sStack_e0.__ss_padding[0x53] = '\0';
  sStack_e0.__ss_padding[0x54] = '\0';
  sStack_e0.__ss_padding[0x55] = '\0';
  sStack_e0.__ss_padding[0x56] = '\0';
  sStack_e0.__ss_padding[0x57] = '\0';
  sStack_e0.__ss_padding[0x58] = '\0';
  sStack_e0.__ss_padding[0x59] = '\0';
  sStack_e0.__ss_padding[0x5a] = '\0';
  sStack_e0.__ss_padding[0x5b] = '\0';
  sStack_e0.__ss_padding[0x5c] = '\0';
  sStack_e0.__ss_padding[0x5d] = '\0';
  sStack_e0.__ss_padding[0x5e] = '\0';
  sStack_e0.__ss_padding[0x5f] = '\0';
  sStack_e0.__ss_padding[0x60] = '\0';
  sStack_e0.__ss_padding[0x61] = '\0';
  sStack_e0.__ss_padding[0x62] = '\0';
  sStack_e0.__ss_padding[99] = '\0';
  sStack_e0.__ss_padding[100] = '\0';
  sStack_e0.__ss_padding[0x65] = '\0';
  sStack_e0.__ss_padding[0x66] = '\0';
  sStack_e0.__ss_padding[0x67] = '\0';
  sStack_e0.__ss_padding[0x68] = '\0';
  sStack_e0.__ss_padding[0x69] = '\0';
  sStack_e0.__ss_padding[0x6a] = '\0';
  sStack_e0.__ss_padding[0x6b] = '\0';
  sStack_e0.__ss_padding[0x6c] = '\0';
  sStack_e0.__ss_padding[0x6d] = '\0';
  sStack_e0.__ss_padding[0x6e] = '\0';
  sStack_e0.__ss_padding[0x6f] = '\0';
  sStack_e0.__ss_padding[0x70] = '\0';
  sStack_e0.__ss_padding[0x71] = '\0';
  sStack_e0.__ss_padding[0x72] = '\0';
  sStack_e0.__ss_padding[0x73] = '\0';
  sStack_e0.__ss_padding[0x74] = '\0';
  sStack_e0.__ss_padding[0x75] = '\0';
  sStack_e0.__ss_align = 0;
  pcVar5 = strrchr((char *)owner,0x3a);
  if (pcVar5 == (char *)0x0) {
    nn_btcp_start_listening_cold_5();
LAB_0012c6d4:
    nn_btcp_start_listening_cold_4();
LAB_0012c6d9:
    nn_btcp_start_listening_cold_1();
  }
  else {
    sVar6 = strlen((char *)owner);
    pcVar5 = pcVar5 + 1;
    iVar2 = nn_port_resolve(pcVar5,(size_t)((long)owner + (sVar6 - (long)pcVar5)));
    if (iVar2 < 0) goto LAB_0012c6d4;
    sStack_e8 = 4;
    nn_epbase_getopt(&self_02->epbase,0,0xe,&iStack_f4,&sStack_e8);
    if (sStack_e8 != 4) goto LAB_0012c6d9;
    iVar3 = nn_iface_resolve((char *)owner,(size_t)(pcVar5 + ~(ulong)owner),iStack_f4,&sStack_e0,
                             &sStack_f0);
    if (iVar3 == 0) {
      sStack_f0 = 0x10;
      if (sStack_e0.ss_family != 2) {
        if (sStack_e0.ss_family != 10) {
          nn_btcp_start_listening_cold_3();
          if (owner[8].owner == (nn_fsm *)0x0) {
            self_03 = (nn_fsm *)0x740;
            pnVar7 = (nn_atcp *)nn_alloc_(0x740);
            owner[8].owner = (nn_fsm *)pnVar7;
            if (pnVar7 != (nn_atcp *)0x0) {
              nn_atcp_init(pnVar7,2,(nn_epbase *)&owner[1].shutdown_fn,owner);
              nn_atcp_start((nn_atcp *)owner[8].owner,(nn_usock *)&owner[1].srcptr);
              return;
            }
          }
          else {
            nn_btcp_start_accepting_cold_1();
            self_03 = owner;
          }
          nn_btcp_start_accepting_cold_2();
          if (self_03 != (nn_fsm *)0x0) {
            self_03 = (nn_fsm *)&self_03[-2].stopped.item;
          }
          nn_fsm_stop(self_03);
          return;
        }
        sStack_f0 = 0x1c;
      }
      sStack_e0.__ss_padding._0_2_ = (ushort)iVar2 << 8 | (ushort)iVar2 >> 8;
      self_00 = &self_02->usock;
      iVar2 = nn_usock_start(self_00,(uint)sStack_e0.ss_family,1,0);
      if (-1 < iVar2) {
        iVar2 = nn_usock_bind(self_00,(sockaddr *)&sStack_e0,sStack_f0);
        if ((-1 < iVar2) && (iVar2 = nn_usock_listen(self_00,100), -1 < iVar2)) {
          nn_btcp_start_accepting(self_02);
          self_02->state = 2;
          return;
        }
        nn_usock_stop(self_00);
        self_02->state = 8;
        return;
      }
      goto LAB_0012c6e5;
    }
  }
  nn_btcp_start_listening_cold_2();
LAB_0012c6e5:
  nn_backoff_start(&self_02->retry);
  self_02->state = 7;
  return;
}

Assistant:

static void nn_btcp_shutdown (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_btcp *btcp;
    struct nn_list_item *it;
    struct nn_atcp *atcp;

    btcp = nn_cont (self, struct nn_btcp, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_backoff_stop (&btcp->retry);
        if (btcp->atcp) {
            nn_atcp_stop (btcp->atcp);
            btcp->state = NN_BTCP_STATE_STOPPING_ATCP;
        }
        else {
            btcp->state = NN_BTCP_STATE_STOPPING_USOCK;
        }
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_ATCP)) {
        if (!nn_atcp_isidle (btcp->atcp))
            return;
        nn_atcp_term (btcp->atcp);
        nn_free (btcp->atcp);
        btcp->atcp = NULL;
        nn_usock_stop (&btcp->usock);
        btcp->state = NN_BTCP_STATE_STOPPING_USOCK;
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_USOCK)) {
       if (!nn_usock_isidle (&btcp->usock) ||
             !nn_backoff_isidle (&btcp->retry))
            return;
        for (it = nn_list_begin (&btcp->atcps);
              it != nn_list_end (&btcp->atcps);
              it = nn_list_next (&btcp->atcps, it)) {
            atcp = nn_cont (it, struct nn_atcp, item);
            nn_atcp_stop (atcp);
        }
        btcp->state = NN_BTCP_STATE_STOPPING_ATCPS;
        goto atcps_stopping;
    }
    if (nn_slow (btcp->state == NN_BTCP_STATE_STOPPING_ATCPS)) {
        nn_assert (src == NN_BTCP_SRC_ATCP && type == NN_ATCP_STOPPED);
        atcp = (struct nn_atcp *) srcptr;
        nn_list_erase (&btcp->atcps, &atcp->item);
        nn_atcp_term (atcp);
        nn_free (atcp);

        /*  If there are no more atcp state machines, we can stop the whole
            btcp object. */
atcps_stopping:
        if (nn_list_empty (&btcp->atcps)) {
            btcp->state = NN_BTCP_STATE_IDLE;
            nn_fsm_stopped_noevent (&btcp->fsm);
            nn_epbase_stopped (&btcp->epbase);
            return;
        }

        return;
    }

    nn_fsm_bad_action(btcp->state, src, type);
}